

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

InnerProductLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(NeuralNetworkLayer *this)

{
  bool bVar1;
  InnerProductLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_innerproduct(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_innerproduct(this);
    this_00 = (InnerProductLayerParams *)operator_new(0x38);
    InnerProductLayerParams::InnerProductLayerParams(this_00);
    (this->layer_).innerproduct_ = this_00;
  }
  return (InnerProductLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::InnerProductLayerParams* NeuralNetworkLayer::mutable_innerproduct() {
  if (!has_innerproduct()) {
    clear_layer();
    set_has_innerproduct();
    layer_.innerproduct_ = new ::CoreML::Specification::InnerProductLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.innerProduct)
  return layer_.innerproduct_;
}